

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O0

Result __thiscall
wabt::LexerSourceBuffer::ReadRange
          (LexerSourceBuffer *this,OffsetRange range,vector<char,_std::allocator<char>_> *out_data)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  void *__src;
  char *__dest;
  unsigned_long uVar3;
  void *src;
  OffsetRange clamped;
  vector<char,_std::allocator<char>_> *out_data_local;
  LexerSourceBuffer *this_local;
  OffsetRange range_local;
  
  clamped.start = range.end;
  src = (void *)range.start;
  clamped.end = (unsigned_long)out_data;
  range_local.start = clamped.start;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&src,&this->size_);
  src = (void *)*puVar1;
  puVar1 = std::min<unsigned_long>(&clamped.start,&this->size_);
  clamped.start = *puVar1;
  uVar2 = Range<unsigned_long>::size((Range<unsigned_long> *)&src);
  uVar3 = clamped.end;
  if (uVar2 != 0) {
    uVar2 = Range<unsigned_long>::size((Range<unsigned_long> *)&src);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)uVar3,uVar2);
    __src = (void *)((long)this->data_ + (long)src);
    __dest = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)clamped.end);
    uVar3 = Range<unsigned_long>::size((Range<unsigned_long> *)&src);
    memcpy(__dest,__src,uVar3);
  }
  Result::Result((Result *)((long)&range_local.end + 4),Ok);
  return (Result)range_local.end._4_4_;
}

Assistant:

Result LexerSourceBuffer::ReadRange(OffsetRange range,
                                    std::vector<char>* out_data) {
  OffsetRange clamped = range;
  clamped.start = std::min(clamped.start, size_);
  clamped.end = std::min(clamped.end, size_);
  if (clamped.size()) {
    out_data->resize(clamped.size());
    const void* src = static_cast<const char*>(data_) + clamped.start;
    memcpy(out_data->data(), src, clamped.size());
  }
  return Result::Ok;
}